

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzellipse3d.cpp
# Opt level: O3

void __thiscall
pzgeom::TPZEllipse3D::GradX<double>
          (TPZEllipse3D *this,TPZFMatrix<double> *cornerco,TPZVec<double> *par,
          TPZFMatrix<double> *gradx)

{
  double dVar1;
  long lVar2;
  long lVar3;
  int i;
  double dVar4;
  double dVar5;
  double dVar6;
  TPZFNMatrix<3,_double> dxcoloc;
  TPZFNMatrix<3,_double> dxcoglob;
  TPZFMatrix<double> local_220;
  double local_190 [4];
  TPZFMatrix<double> local_170;
  TPZFMatrix<double> local_e0;
  double local_50 [4];
  
  dVar4 = this->fAngleIni;
  dVar6 = this->fAngleFinal;
  dVar1 = *par->fStore;
  local_220.fElem = local_190;
  local_220.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
  local_220.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
  local_220.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_220.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_220.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018454a8;
  local_220.fSize = 3;
  local_220.fGiven = local_220.fElem;
  TPZVec<int>::TPZVec(&local_220.fPivot.super_TPZVec<int>,0);
  local_220.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_220.fPivot.super_TPZVec<int>.fStore = local_220.fPivot.fExtAlloc;
  local_220.fPivot.super_TPZVec<int>.fNElements = 0;
  local_220.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_220.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_220.fWork.fStore = (double *)0x0;
  local_220.fWork.fNElements = 0;
  local_220.fWork.fNAlloc = 0;
  local_220.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_018451b8;
  TPZFMatrix<double>::operator=(&local_220,0.0);
  local_e0.fElem = local_50;
  local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
  local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
  local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018454a8;
  local_e0.fSize = 3;
  local_e0.fGiven = local_e0.fElem;
  TPZVec<int>::TPZVec(&local_e0.fPivot.super_TPZVec<int>,0);
  local_e0.fPivot.super_TPZVec<int>.fStore = local_e0.fPivot.fExtAlloc;
  local_e0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_e0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_e0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_e0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_e0.fWork.fStore = (double *)0x0;
  local_e0.fWork.fNElements = 0;
  local_e0.fWork.fNAlloc = 0;
  local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_018451b8;
  TPZFMatrix<double>::operator=(&local_e0,0.0);
  dVar6 = dVar6 - dVar4;
  dVar4 = (dVar1 + 1.0) * 0.5 * dVar6 + dVar4;
  dVar1 = this->fsAxeX;
  dVar5 = sin(dVar4);
  if ((local_220.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
     (local_220.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  *local_220.fElem = dVar5 * -dVar1;
  dVar1 = this->fsAxeY;
  dVar4 = cos(dVar4);
  if ((1 < local_220.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow) &&
     (0 < local_220.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol)) {
    local_220.fElem[1] = dVar1 * dVar4;
    local_170.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
    local_170.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 3;
    local_170.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_170.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_170.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_018151d8;
    local_170.fElem = (double *)0x0;
    local_170.fGiven = (double *)0x0;
    local_170.fSize = 0;
    TPZVec<int>::TPZVec(&local_170.fPivot.super_TPZVec<int>,0);
    local_170.fPivot.super_TPZVec<int>.fStore = local_170.fPivot.fExtAlloc;
    local_170.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
    local_170.fPivot.super_TPZVec<int>.fNElements = 0;
    local_170.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_170.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
    local_170.fWork.fStore = (double *)0x0;
    local_170.fWork.fNElements = 0;
    local_170.fWork.fNAlloc = 0;
    local_170.fElem = (double *)operator_new__(0x48);
    lVar3 = 0;
    do {
      lVar2 = 0;
      do {
        if ((local_170.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar3) ||
           (local_170.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar2)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        local_170.fElem[local_170.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar2 + lVar3]
             = (this->fAxes).super_TPZFMatrix<double>.fElem
               [(this->fAxes).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
                fRow * lVar2 + lVar3];
        lVar2 = lVar2 + 1;
      } while (lVar2 != 3);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    TPZFMatrix<double>::MultAdd(&local_170,&local_220,&local_220,&local_e0,1.0,0.0,1);
    lVar3 = 0;
    while( true ) {
      if ((local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar3) ||
         (local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar3) ||
         ((gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) break;
      gradx->fElem[lVar3] = local_e0.fElem[lVar3] * dVar6 * 0.5;
      lVar3 = lVar3 + 1;
      if (lVar3 == 3) {
        TPZFMatrix<double>::~TPZFMatrix(&local_170);
        TPZFMatrix<double>::~TPZFMatrix(&local_e0,&PTR_PTR_01845470);
        TPZFMatrix<double>::~TPZFMatrix(&local_220,&PTR_PTR_01845470);
        return;
      }
    }
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h",
             0x26d);
}

Assistant:

void TPZEllipse3D::GradX(TPZFMatrix<REAL> &cornerco, TPZVec<T> &par, TPZFMatrix<T> &gradx) const
{
    REAL delangle = fAngleFinal - fAngleIni;
    T dangledqsi = 1./2.*delangle;
    T angle = fAngleIni + (par[0]+1.)/2.*delangle;
    TPZFNMatrix<3,T> dxcoloc(3,1,0.),dxcoglob(3,1,0.);
    dxcoloc(0,0) = -fsAxeX*sin(angle);
    dxcoloc(1,0) = fsAxeY*cos(angle);
    int transp = 1;
    TPZFMatrix<T> axloc(3,3);
    for (int i=0; i<3; i++) {
        for (int j=0; j<3; j++) {
            axloc(i,j) = fAxes.GetVal(i,j);
        }
    }
    axloc.MultAdd(dxcoloc, dxcoloc, dxcoglob,1.,0.,transp);
    for (int i=0; i<3; i++) {
        gradx(i,0) = dangledqsi*dxcoglob(i,0);
    }

}